

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O1

void gatom_clipfloat(t_gatom *x,t_atom *ap,t_float f)

{
  float fVar1;
  
  fVar1 = x->a_draglo;
  if ((((fVar1 != 0.0) || (NAN(fVar1))) || (x->a_draghi != 0.0)) || (NAN(x->a_draghi))) {
    if (fVar1 <= f) {
      fVar1 = f;
    }
    f = fVar1;
    if (x->a_draghi < fVar1) {
      f = x->a_draghi;
    }
  }
  (ap->a_w).w_float = f;
  gatom_senditup(x);
  gatom_bang(x);
  return;
}

Assistant:

static void gatom_clipfloat(t_gatom *x, t_atom *ap, t_float f)
{
    if (x->a_draglo != 0 || x->a_draghi != 0)
    {
        if (f < x->a_draglo)
            f = x->a_draglo;
        if (f > x->a_draghi)
            f = x->a_draghi;
    }
    ap->a_w.w_float = f;
    gatom_senditup(x);
    gatom_bang(x);
}